

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmu_helper.c
# Opt level: O3

int get_physical_address_wtlb
              (CPUPPCState_conflict2 *env,mmu_ctx_t_conflict *ctx,target_ulong eaddr,int rw,
              int access_type,int mmu_idx)

{
  ppcmas_tlb_t *tlb;
  powerpc_mmu_t pVar1;
  ulong uVar2;
  ppcemb_tlb_t_conflict2 *ppVar3;
  target_ulong tVar4;
  byte bVar5;
  bool bVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  char cVar10;
  sbyte sVar11;
  target_ulong tVar12;
  long lVar13;
  ulong uVar14;
  CPUPPCState_conflict2 *env_00;
  long lVar15;
  byte bVar16;
  char *fmt;
  uint uVar17;
  hwaddr hVar18;
  uint uVar19;
  uint uVar20;
  ulong uVar21;
  uint uVar22;
  long lVar23;
  byte bVar24;
  CPUPPCState_conflict2 *__mptr;
  int in_stack_ffffffffffffff58;
  ppcemb_tlb_t_conflict2 local_98;
  mmu_ctx_t_conflict *local_70;
  uint local_64;
  long local_60;
  ulong local_58;
  ulong local_50;
  ulong local_48;
  ulong local_40;
  long local_38;
  
  uVar21 = (ulong)(uint)mmu_idx;
  pVar1 = env->mmu_model;
  if (7 < pVar1 - POWERPC_MMU_SOFT_6xx) {
    fmt = "Unknown or invalid MMU model\n";
LAB_00b5c06d:
    cpu_abort_ppc64((CPUState *)&env[-1].spr_cb[0x1bf].oea_write,fmt);
  }
  local_98.PID = env->msr;
  uVar19 = (uint)(access_type == 0x10) * 0x10 + 0x10;
  uVar20 = (uint)local_98.PID;
  local_70 = ctx;
  local_98.size._4_4_ = rw;
  local_98.attr = access_type;
  switch(pVar1) {
  default:
    if ((uVar20 & uVar19) != 0) {
      uVar19 = (uint)eaddr;
      if ((ulong)env->nb_BATs != 0) {
        uVar21 = (ulong)(access_type == 0x10);
        uVar14 = 0;
        do {
          uVar2 = env->DBAT[(ulong)(access_type == 0x10) * 2][uVar14];
          uVar8 = (uint)uVar2;
          if (((uVar20 >> 0xe & 1) == 0) && ((uVar2 & 2) != 0)) {
LAB_00b5b6d8:
            bVar6 = true;
            uVar17 = (uint)env->DBAT[uVar21 * 2 + 1][uVar14] & 3;
            if (uVar17 != 0) {
              if (uVar17 == 2) {
                uVar17 = 7;
              }
              else {
                uVar17 = 5;
              }
            }
          }
          else {
            bVar6 = false;
            if ((uVar20 >> 0xe & 1) == 0) {
              uVar17 = 0;
            }
            else {
              uVar17 = 0;
              bVar6 = false;
              if ((uVar2 & 1) != 0) goto LAB_00b5b6d8;
            }
          }
          if ((((uVar8 ^ uVar19) & 0xf0000000) == 0) &&
             (uVar22 = (uVar8 & 0x1ffc) << 0xf,
             bVar6 && (~uVar22 & uVar19 & 0xffe0000) == (uVar8 & 0xffe0000))) {
            ctx->raddr = (ulong)(uVar19 & (uVar22 | 0x1f000) |
                                (uint)env->DBAT[uVar21 * 2 + 1][uVar14] & 0xfffe0000);
            ctx->prot = uVar17;
            uVar8 = 4;
            if (access_type != 0x10) {
              uVar8 = 2 - (rw == 0);
            }
            if ((uVar17 & uVar8) != 0) {
              return 0;
            }
            break;
          }
          uVar14 = uVar14 + 1;
        } while (env->nb_BATs != uVar14);
      }
      ctx->eaddr = eaddr;
      uVar21 = env->sr[eaddr >> 0x1c];
      uVar8 = (uint)uVar21;
      if (((uVar8 >> 0x1d & 1) == 0) || (uVar17 = 1, (uVar20 >> 0xe & 1) == 0)) {
        uVar17 = (uint)((uVar20 >> 0xe & 1) == 0 & (byte)(uVar21 >> 0x1e) & 3);
      }
      ctx->key = uVar17;
      uVar19 = uVar19 & 0xfffffff;
      ctx->nx = (uint)(uVar21 >> 0x1c) & 1;
      ctx->ptem = (ulong)(uVar19 >> 0x16 | (uVar8 & 0xffffff) << 7);
      if (-1 < (int)uVar8) {
        uVar14 = (ulong)(uVar8 & 0xffffff ^ uVar19 >> 0xc);
        if (access_type == 0x10) {
          if ((uVar21 >> 0x1c & 1) != 0) {
            return -3;
          }
          ctx->hash[0] = uVar14;
          ctx->hash[1] = ~uVar14;
          ctx->raddr = 0xffffffffffffffff;
          iVar9 = 0x10;
        }
        else {
          ctx->hash[0] = uVar14;
          ctx->hash[1] = ~uVar14;
          ctx->raddr = 0xffffffffffffffff;
          iVar9 = access_type;
        }
        iVar9 = ppc6xx_tlb_check(env,ctx,eaddr,rw,iVar9);
        return iVar9;
      }
      uVar20 = (uint)env->sr[eaddr >> 0x1c];
      if ((uVar20 & 0x1ff00000) != 0x7f00000) {
        uVar19 = access_type << 0x1c | access_type - 0x10U >> 4;
        if (uVar19 == 1) {
          if (rw == 1) {
            if (uVar17 == 0) {
              return -2;
            }
          }
          else if (uVar17 != 0 || rw != 0) {
            return -2;
          }
          ctx->raddr = eaddr;
          return 2;
        }
        local_98.RPN = eaddr;
        if (uVar19 != 5) {
          return -4;
        }
LAB_00b5be70:
        local_70->raddr = local_98.RPN;
        return 0;
      }
      ctx->raddr = (ulong)(uVar20 << 0x1c | uVar19);
      goto LAB_00b5ba80;
    }
    break;
  case POWERPC_MMU_SOFT_4xx:
  case POWERPC_MMU_SOFT_4xx_Z:
    if ((uVar20 & uVar19) != 0) {
      iVar9 = env->nb_tlb;
      if ((long)iVar9 < 1) {
        return -1;
      }
      uVar19 = 4;
      if (access_type != 0x10) {
        uVar19 = 2 - (rw == 0);
      }
      iVar7 = -1;
      lVar15 = 0;
      do {
        ppVar3 = (env->tlb).tlbe;
        uVar8 = *(uint *)((long)&ppVar3->prot + lVar15);
        if ((uVar8 & 8) != 0) {
          uVar21 = *(ulong *)((long)&ppVar3->PID + lVar15);
          lVar23 = *(long *)((long)&ppVar3->size + lVar15);
          if (((uVar21 == 0) || (uVar21 == (uint)env->spr[0x3b1])) &&
             (uVar21 = -lVar23, (uVar21 & eaddr) == *(ulong *)((long)&ppVar3->EPN + lVar15))) {
            uVar14 = *(ulong *)((long)&ppVar3->RPN + lVar15);
            switch((uint)(env->spr[0x3b0] >>
                         ((byte)~*(byte *)((long)&ppVar3->attr + lVar15) >> 3 & 0x1e)) & 3) {
            case 0:
              if ((uVar20 >> 0xe & 1) == 0) goto switchD_00b5b8bf_caseD_1;
              env->spr[0x3d4] = 0x400000;
              ctx->prot = 0;
              break;
            case 2:
              if ((uVar20 >> 0xe & 1) == 0) goto switchD_00b5b8bf_caseD_3;
            case 1:
switchD_00b5b8bf_caseD_1:
              ctx->prot = uVar8;
              if ((uVar8 & uVar19) != 0) {
                hVar18 = lVar23 - 1U & eaddr | uVar14 & uVar21;
LAB_00b5bfcc:
                ctx->raddr = hVar18;
                return 0;
              }
              env->spr[0x3d4] = 0;
              break;
            case 3:
switchD_00b5b8bf_caseD_3:
              hVar18 = lVar23 - 1U & eaddr | uVar14 & uVar21;
              ctx->prot = 7;
              goto LAB_00b5bfcc;
            }
            iVar7 = -2;
          }
        }
        lVar15 = lVar15 + 0x28;
        if ((long)iVar9 * 0x28 == lVar15) {
          return iVar7;
        }
      } while( true );
    }
    ctx->raddr = eaddr;
    ctx->prot = 5;
    if (pVar1 == POWERPC_MMU_SOFT_4xx_Z) {
      if ((local_98.PID & 8) == 0) {
        return 0;
      }
      if (((env->pb[1] <= eaddr) || (eaddr < env->pb[0])) ||
         (bVar6 = true, env->pb[1] <= env->pb[0])) {
        if (eaddr < env->pb[2] || env->pb[3] <= env->pb[2]) {
          bVar6 = false;
        }
        else {
          bVar6 = eaddr < env->pb[3];
        }
      }
      if (bVar6 != ((uVar20 >> 2 & 1) != 0)) {
        return (uint)(rw != 1) * 2 + -2;
      }
    }
    goto LAB_00b5ba80;
  case POWERPC_MMU_REAL:
    if ((uVar20 & uVar19) != 0) {
      fmt = "PowerPC in real mode do not do any translation\n";
      goto LAB_00b5c06d;
    }
    break;
  case POWERPC_MMU_MPC8xx:
    fmt = "MPC8xx MMU model is not implemented\n";
    goto LAB_00b5c06d;
  case POWERPC_MMU_BOOKE:
    local_98.RPN = 0xffffffffffffffff;
    lVar15 = (long)env->nb_tlb;
    if (lVar15 < 1) {
      return -1;
    }
    env_00 = (CPUPPCState_conflict2 *)(env->tlb).tlbe;
    tVar4 = env->spr[0x30];
    iVar9 = env->nb_pids;
    local_50 = (ulong)((uint)(local_98.PID >> 4) & 1);
    do {
      iVar7 = ppcemb_tlb_check(env_00,&local_98,(hwaddr *)eaddr,(ulong)(uint)tVar4,
                               (uint)(iVar9 == 0),(int)uVar21,in_stack_ffffffffffffff58);
      if (iVar7 < 0) {
        if (((env->spr[0x279] != 0) && (uVar19 = (uint)env_00->gpr[4], (uVar19 & 8) != 0)) &&
           (env_00->gpr[2] == 0 || env_00->gpr[2] == (env->spr[0x279] & 0xffffffff))) {
          tVar12 = env_00->gpr[3];
          uVar14 = -tVar12;
          if ((uVar14 & eaddr) != env_00->gpr[1]) goto LAB_00b5b9f6;
LAB_00b5ba39:
          local_98.RPN = tVar12 - 1 & eaddr | uVar14 & env_00->gpr[0];
          goto LAB_00b5b994;
        }
LAB_00b5b9f6:
        if (((env->spr[0x27a] != 0) && (uVar19 = (uint)env_00->gpr[4], (uVar19 & 8) != 0)) &&
           (env_00->gpr[2] == 0 || env_00->gpr[2] == (env->spr[0x27a] & 0xffffffff))) {
          tVar12 = env_00->gpr[3];
          uVar14 = -tVar12;
          if ((uVar14 & eaddr) == env_00->gpr[1]) goto LAB_00b5ba39;
        }
      }
      else {
        uVar19 = (uint)env_00->gpr[4];
LAB_00b5b994:
        uVar8 = *(uint *)((long)env_00->gpr + 0x24) & 1;
        if (local_98.attr == 0x10) {
          if ((uVar20 >> 5 & 1) == uVar8) {
            uVar20 = uVar19 >> 4;
            if (((uint)local_98.PID >> 0xe & 1) != 0) {
              uVar20 = uVar19;
            }
            local_70->prot = uVar20 & 0xf;
            if ((uVar20 & 4) == 0) {
              return -3;
            }
LAB_00b5bf86:
            local_70->raddr = local_98.RPN;
            return 0;
          }
        }
        else if ((uint)local_50 == uVar8) {
          uVar20 = uVar19 >> 4;
          if (((uint)local_98.PID >> 0xe & 1) != 0) {
            uVar20 = uVar19;
          }
          local_70->prot = uVar20 & 0xf;
          if ((local_98.size._4_4_ != 0) || ((uVar20 & 1) == 0)) {
            if (local_98.size._4_4_ == 0) {
              return -2;
            }
            if ((uVar20 & 2) == 0) {
              return -2;
            }
          }
          goto LAB_00b5bf86;
        }
      }
      env_00 = (CPUPPCState_conflict2 *)(env_00->gpr + 5);
      lVar15 = lVar15 + -1;
      if (lVar15 == 0) {
        return -1;
      }
    } while( true );
  case POWERPC_MMU_BOOKE206:
    local_98.RPN = 0xffffffffffffffff;
    local_48 = eaddr >> 0xc;
    local_64 = mmu_idx & 0xfffffffe;
    local_38 = (ulong)(mmu_idx == 9) * 8 + 0x28b0;
    bVar5 = (byte)((local_98.PID & 0xffffffff) >> 4) & 0xf;
    local_98.prot = (uint)(local_98.PID >> 0xe) & 1;
    local_40 = (ulong)(uVar20 >> 5 & 1);
    lVar15 = 0;
    do {
      uVar19 = (uint)env->spr[lVar15 + 0x2b0];
      if (0xffffff < uVar19) {
        uVar20 = uVar19 & 0xfff;
        if (uVar20 == 0) {
          cVar10 = '\0';
        }
        else {
          iVar9 = 0;
          if (uVar20 != 0) {
            for (; (uVar20 >> iVar9 & 1) == 0; iVar9 = iVar9 + 1) {
            }
          }
          cVar10 = (char)iVar9;
        }
        uVar19 = uVar19 >> 0x18;
        uVar21 = (ulong)uVar19;
        iVar9 = 0;
        if (uVar19 != 0) {
          for (; (uVar19 >> iVar9 & 1) == 0; iVar9 = iVar9 + 1) {
          }
        }
        local_50 = CONCAT44(local_50._4_4_,uVar19 + 0x7fffffff);
        lVar23 = (ulong)(~(-1 << (cVar10 - (byte)iVar9 & 0x1f)) & (uint)local_48) <<
                 ((byte)iVar9 & 0x3f);
        uVar19 = 0;
        local_98.EPN._4_4_ = uVar20;
        local_60 = lVar23;
        local_58 = uVar21;
        do {
          uVar8 = uVar19 & (uint)local_50 | (uint)lVar23;
          if ((int)uVar8 < (int)uVar20) {
            if (lVar15 != 0) {
              lVar13 = 0;
              do {
                uVar8 = uVar8 + ((uint)env->spr[lVar13 + 0x2b0] & 0xfff);
                lVar13 = lVar13 + 1;
              } while (lVar15 != lVar13);
            }
            if ((env->tlb).tlb6 != (ppc6xx_tlb_t_conflict2 *)0x0) {
              tlb = (ppcmas_tlb_t *)((env->tlb).tlb6 + (int)uVar8);
              if (local_64 == 8) {
                uVar8 = *(uint *)((long)env->gpr + local_38);
                iVar9 = ppcmas_tlb_check((CPUPPCState_conflict2 *)local_98.PID,tlb,&local_98.RPN,
                                         eaddr,uVar8 & 0xff);
                uVar21 = local_58;
                lVar23 = local_60;
                uVar20 = local_98.EPN._4_4_;
                if (-1 < iVar9) {
                  bVar16 = (byte)(uVar8 >> 0x18);
                  bVar24 = bVar16 >> 7;
                  bVar16 = bVar16 >> 6;
LAB_00b5bc56:
                  uVar8 = (uint)tlb->mas7_3;
                  if (bVar24 == 0) {
                    uVar17 = uVar8 >> 1 & 2 | uVar8 & 1;
                    sVar11 = 2;
                  }
                  else {
                    uVar17 = uVar8 >> 2 & 2 | uVar8 >> 1 & 1;
                    sVar11 = 3;
                  }
                  uVar21 = local_58;
                  lVar23 = local_60;
                  uVar20 = local_98.EPN._4_4_;
                  if (local_98.attr == 0x10) {
                    if (local_64 == 8) {
                      __assert_fail("!use_epid",
                                    "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/ppc/mmu_helper.c"
                                    ,0x432,
                                    "int mmubooke206_check_tlb(CPUPPCState *, ppcmas_tlb_t *, hwaddr *, int *, target_ulong, int, int, int)"
                                   );
                    }
                    if ((uint)local_40 == (uint)((tlb->mas1 >> 0xc & 1) != 0)) {
                      uVar19 = uVar8 >> sVar11 & 4;
                      local_70->prot = uVar17 | uVar19;
                      iVar9 = -3;
joined_r0x00b5be46:
                      if (uVar19 == 0) {
                        return iVar9;
                      }
                      goto LAB_00b5be70;
                    }
                  }
                  else if ((tlb->mas1 >> 0xc & 1) == (uint)(bVar16 & 1)) {
                    local_70->prot = uVar8 >> sVar11 & 4 | uVar17;
                    if ((local_98.size._4_4_ != 0) || ((uVar17 & 1) == 0)) {
                      iVar9 = -2;
                      if (local_98.size._4_4_ == 0) {
                        return -2;
                      }
                      uVar19 = uVar17 & 0xfffffffe;
                      goto joined_r0x00b5be46;
                    }
                    goto LAB_00b5be70;
                  }
                }
              }
              else {
                iVar9 = ppcmas_tlb_check((CPUPPCState_conflict2 *)local_98.PID,tlb,&local_98.RPN,
                                         eaddr,(uint32_t)env->spr[0x30]);
                bVar24 = (byte)local_98.prot;
                bVar16 = bVar5;
                if (-1 < iVar9) goto LAB_00b5bc56;
                if (env->spr[0x279] != 0) {
                  iVar9 = ppcmas_tlb_check((CPUPPCState_conflict2 *)local_98.PID,tlb,&local_98.RPN,
                                           eaddr,(uint32_t)env->spr[0x279]);
                  bVar24 = (byte)local_98.prot;
                  if (-1 < iVar9) goto LAB_00b5bc56;
                }
                uVar21 = local_58;
                lVar23 = local_60;
                uVar20 = local_98.EPN._4_4_;
                if (env->spr[0x27a] != 0) {
                  iVar9 = ppcmas_tlb_check((CPUPPCState_conflict2 *)local_98.PID,tlb,&local_98.RPN,
                                           eaddr,(uint32_t)env->spr[0x27a]);
                  bVar24 = (byte)local_98.prot;
                  uVar21 = local_58;
                  lVar23 = local_60;
                  uVar20 = local_98.EPN._4_4_;
                  if (-1 < iVar9) goto LAB_00b5bc56;
                }
              }
            }
          }
          uVar19 = uVar19 + 1;
        } while (uVar19 != (uint)uVar21);
      }
      lVar15 = lVar15 + 1;
      if (lVar15 == 4) {
        return -1;
      }
    } while( true );
  }
  ctx->raddr = eaddr;
LAB_00b5ba80:
  ctx->prot = 7;
  return 0;
}

Assistant:

static int get_physical_address_wtlb(
    CPUPPCState *env, mmu_ctx_t *ctx,
    target_ulong eaddr, int rw, int access_type,
    int mmu_idx)
{
    int ret = -1;
    bool real_mode = (access_type == ACCESS_CODE && msr_ir == 0)
        || (access_type != ACCESS_CODE && msr_dr == 0);

    switch (env->mmu_model) {
    case POWERPC_MMU_SOFT_6xx:
    case POWERPC_MMU_SOFT_74xx:
        if (real_mode) {
            ret = check_physical(env, ctx, eaddr, rw);
        } else {
            /* Try to find a BAT */
            if (env->nb_BATs != 0) {
                ret = get_bat_6xx_tlb(env, ctx, eaddr, rw, access_type);
            }
            if (ret < 0) {
                /* We didn't match any BAT entry or don't have BATs */
                ret = get_segment_6xx_tlb(env, ctx, eaddr, rw, access_type);
            }
        }
        break;

    case POWERPC_MMU_SOFT_4xx:
    case POWERPC_MMU_SOFT_4xx_Z:
        if (real_mode) {
            ret = check_physical(env, ctx, eaddr, rw);
        } else {
            ret = mmu40x_get_physical_address(env, ctx, eaddr,
                                              rw, access_type);
        }
        break;
    case POWERPC_MMU_BOOKE:
        ret = mmubooke_get_physical_address(env, ctx, eaddr,
                                            rw, access_type);
        break;
    case POWERPC_MMU_BOOKE206:
        ret = mmubooke206_get_physical_address(env, ctx, eaddr, rw,
                                               access_type, mmu_idx);
        break;
    case POWERPC_MMU_MPC8xx:
        /* XXX: TODO */
        cpu_abort(env_cpu(env), "MPC8xx MMU model is not implemented\n");
        break;
    case POWERPC_MMU_REAL:
        if (real_mode) {
            ret = check_physical(env, ctx, eaddr, rw);
        } else {
            cpu_abort(env_cpu(env),
                      "PowerPC in real mode do not do any translation\n");
            return -1;
        }
        break;
    default:
        cpu_abort(env_cpu(env), "Unknown or invalid MMU model\n");
        return -1;
    }

    return ret;
}